

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O0

void __thiscall P2PSocket::P2PSocket(P2PSocket *this,int maxPeers,bool debug)

{
  P2PSocketException *this_00;
  Peers local_c0;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  undefined1 local_15;
  int local_14;
  bool debug_local;
  P2PSocket *pPStack_10;
  int maxPeers_local;
  P2PSocket *this_local;
  
  this->m_debug = debug;
  local_15 = debug;
  local_14 = maxPeers;
  pPStack_10 = this;
  SocketResource::SocketResource(&this->m_socket,-1);
  Peers::Peers(&this->m_peers);
  Events::Events(&this->m_events);
  this->m_maxPeers = local_14;
  if ((0 < local_14) && (local_14 < 0x100)) {
    Peers::Peers(&local_c0,this);
    Peers::operator=(&this->m_peers,&local_c0);
    Peers::~Peers(&local_c0);
    return;
  }
  local_4d = 1;
  this_00 = (P2PSocketException *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Max peers argument must be a valid single byte unsigned integer",
             &local_39);
  P2PSocketException::P2PSocketException(this_00,&local_38);
  local_4d = 0;
  __cxa_throw(this_00,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
}

Assistant:

P2PSocket::P2PSocket(int maxPeers, bool debug) : m_debug(debug), m_maxPeers(maxPeers)
{
    if (maxPeers < 0x01 || maxPeers > 0xFF) {
        throw P2PSocketException("Max peers argument must be a valid single byte unsigned integer");
    }

    m_peers = Peers(this);
}